

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O1

bool __thiscall QRect::contains(QRect *this,QPoint *p,bool proper)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined3 in_register_00000011;
  
  iVar2 = (this->x1).m_i;
  iVar3 = (this->x2).m_i;
  iVar1 = iVar2 + -1;
  iVar6 = iVar3 + 1;
  if (iVar1 <= iVar3) {
    iVar6 = iVar2;
  }
  if (iVar1 < iVar3) {
    iVar1 = iVar3;
  }
  iVar2 = (p->xp).m_i;
  if (CONCAT31(in_register_00000011,proper) == 0) {
    bVar4 = iVar2 < iVar6;
    bVar5 = iVar1 < iVar2;
  }
  else {
    bVar4 = iVar2 <= iVar6;
    bVar5 = iVar1 <= iVar2;
  }
  if (!(bool)(bVar5 | bVar4)) {
    iVar2 = (this->y1).m_i;
    iVar3 = (this->y2).m_i;
    iVar1 = iVar2 + -1;
    iVar6 = iVar3 + 1;
    if (iVar1 <= iVar3) {
      iVar6 = iVar2;
    }
    if (iVar1 < iVar3) {
      iVar1 = iVar3;
    }
    iVar2 = (p->yp).m_i;
    if (proper) {
      bVar4 = iVar2 <= iVar6;
      bVar5 = iVar1 <= iVar2;
    }
    else {
      bVar4 = iVar2 < iVar6;
      bVar5 = iVar1 < iVar2;
    }
    if (!bVar5 && !bVar4) {
      return true;
    }
  }
  return false;
}

Assistant:

bool QRect::contains(const QPoint &p, bool proper) const noexcept
{
    Representation l, r;
    if (x2 < x1 - 1) {
        l = x2 + 1;
        r = x1 - 1;
    } else {
        l = x1;
        r = x2;
    }
    if (proper) {
        if (p.x() <= l || p.x() >= r)
            return false;
    } else {
        if (p.x() < l || p.x() > r)
            return false;
    }
    Representation t, b;
    if (y2 < y1 - 1) {
        t = y2 + 1;
        b = y1 - 1;
    } else {
        t = y1;
        b = y2;
    }
    if (proper) {
        if (p.y() <= t || p.y() >= b)
            return false;
    } else {
        if (p.y() < t || p.y() > b)
            return false;
    }
    return true;
}